

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::RepeatedWellKnownTypes::Clear(RepeatedWellKnownTypes *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>>
            ((RepeatedPtrFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Api>>
            (&(this->field_0)._impl_.api_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Duration>>
            (&(this->field_0)._impl_.duration_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Empty>>
            (&(this->field_0)._impl_.empty_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldMask>>
            (&(this->field_0)._impl_.field_mask_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceContext>>
            (&(this->field_0)._impl_.source_context_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Struct>>
            (&(this->field_0)._impl_.struct_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Timestamp>>
            (&(this->field_0)._impl_.timestamp_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Type>>
            (&(this->field_0)._impl_.type_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::DoubleValue>>
            (&(this->field_0)._impl_.double_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FloatValue>>
            (&(this->field_0)._impl_.float_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Int64Value>>
            (&(this->field_0)._impl_.int64_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::UInt64Value>>
            (&(this->field_0)._impl_.uint64_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Int32Value>>
            (&(this->field_0)._impl_.int32_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::UInt32Value>>
            (&(this->field_0)._impl_.uint32_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::BoolValue>>
            (&(this->field_0)._impl_.bool_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::StringValue>>
            (&(this->field_0)._impl_.string_field_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::BytesValue>>
            (&(this->field_0)._impl_.bytes_field_.super_RepeatedPtrFieldBase);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedWellKnownTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.RepeatedWellKnownTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.any_field_.Clear();
  _impl_.api_field_.Clear();
  _impl_.duration_field_.Clear();
  _impl_.empty_field_.Clear();
  _impl_.field_mask_field_.Clear();
  _impl_.source_context_field_.Clear();
  _impl_.struct_field_.Clear();
  _impl_.timestamp_field_.Clear();
  _impl_.type_field_.Clear();
  _impl_.double_field_.Clear();
  _impl_.float_field_.Clear();
  _impl_.int64_field_.Clear();
  _impl_.uint64_field_.Clear();
  _impl_.int32_field_.Clear();
  _impl_.uint32_field_.Clear();
  _impl_.bool_field_.Clear();
  _impl_.string_field_.Clear();
  _impl_.bytes_field_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}